

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceRenderTimeCase::init
          (ReferenceRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  DrawMethod DVar1;
  int iVar2;
  int numBytes;
  int numBytes_00;
  char *pcVar3;
  string sStack_1d8;
  string local_1b8;
  undefined1 local_198 [384];
  
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
          m_drawMethod;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,
             ctx);
  local_198._0_8_ =
       ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
        ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Measuring the time used in ");
  pcVar3 = "Draw method: drawElements";
  if (DVar1 == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar3 = "Draw method: drawArrays";
  }
  std::operator<<((ostream *)this_00,pcVar3 + 0xd);
  std::operator<<((ostream *)this_00," and readPixels call with different rendering workloads.\n");
  std::ostream::operator<<
            (this_00,(int)(((long)(this->
                                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                  ).m_results.
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                 ).m_results.
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x48));
  std::operator<<((ostream *)this_00," test samples. Sample order is randomized.\n");
  std::operator<<((ostream *)this_00,
                  "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
                 );
  std::operator<<((ostream *)this_00,"Workload sizes are in the range [");
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar2);
  std::operator<<((ostream *)this_00,",  ");
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar2);
  std::operator<<((ostream *)this_00,"] vertices ([");
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1b8,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes);
  std::operator<<((ostream *)this_00,(string *)&local_1b8);
  std::operator<<((ostream *)this_00,",");
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&sStack_1d8,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes_00);
  std::operator<<((ostream *)this_00,(string *)&sStack_1d8);
  std::operator<<((ostream *)this_00,"] to be processed).\n");
  std::operator<<((ostream *)this_00,
                  "Test result is the approximated total processing rate in MiB / s.\n");
  pcVar3 = glcts::fixed_sample_locations_values + 1;
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    pcVar3 = "Note that index array size is not included in the processed size.\n";
  }
  std::operator<<((ostream *)this_00,pcVar3);
  std::operator<<((ostream *)this_00,
                  "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  iVar2 = std::__cxx11::ostringstream::~ostringstream(this_00);
  return iVar2;
}

Assistant:

void ReferenceRenderTimeCase::init (void)
{
	const char* const targetFunctionName = (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");

	// init parent
	RenderCase<RenderReadDuration>::init();

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
		<< getNumSamples() << " test samples. Sample order is randomized.\n"
		<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
		<< "Workload sizes are in the range ["
			<< getMinWorkloadSize() << ",  "
			<< getMaxWorkloadSize() << "] vertices (["
			<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
			<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
		<< "Test result is the approximated total processing rate in MiB / s.\n"
		<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
		<< "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
		<< tcu::TestLog::EndMessage;
}